

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cpp
# Opt level: O3

int __thiscall step::undo(step *this)

{
  this->bucket1->used = this->bucket1_used_before;
  if (this->bucket2 != (bucket *)0x0) {
    this->bucket2->used = this->bucket2_used_before;
  }
  if (this->step_action == empty) {
    *this->wastage = *this->wastage + this->difference;
  }
  return -this->difference;
}

Assistant:

int step::undo()
{
	bucket1->used = bucket1_used_before;
	if (bucket2)
		bucket2->used = bucket2_used_before;
	if (step_action == action::empty)
		*wastage += difference;
	return -difference;
}